

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O3

void __thiscall
tchecker::syncprod::synchronizer_t::synchronizer_t
          (synchronizer_t *this,shared_ptr<const_tchecker::syncprod::system_t> *system,
          string *separator,string *process_name)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  element_type *peVar3;
  
  (this->_system).super___shared_ptr<const_tchecker::syncprod::system_t,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (system->
            super___shared_ptr<const_tchecker::syncprod::system_t,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  p_Var1 = (system->
           super___shared_ptr<const_tchecker::syncprod::system_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_system).super___shared_ptr<const_tchecker::syncprod::system_t,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->_separator)._M_dataplus._M_p = (pointer)&(this->_separator).field_2;
  pcVar2 = (separator->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_separator,pcVar2,pcVar2 + separator->_M_string_length);
  (this->_process_name)._M_dataplus._M_p = (pointer)&(this->_process_name).field_2;
  pcVar2 = (process_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_process_name,pcVar2,pcVar2 + process_name->_M_string_length);
  peVar3 = (this->_system).
           super___shared_ptr<const_tchecker::syncprod::system_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  tchecker::system::system_t::system_t
            (&this->_product,&(peVar3->super_system_t)._name,&(peVar3->super_system_t)._attributes);
  integer_variables(this);
  clock_variables(this);
  process(this);
  locations_edges_events(this);
  return;
}

Assistant:

synchronizer_t(std::shared_ptr<tchecker::syncprod::system_t const> const & system, std::string const & separator,
                 std::string const & process_name)
      : _system(system), _separator(separator), _process_name(process_name), _product(_system->name(), _system->attributes())
  {
    integer_variables();
    clock_variables();
    process();
    locations_edges_events();
  }